

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void lrtr_dbg(char *frmt,...)

{
  long lVar1;
  FILE *__stream;
  char in_AL;
  int iVar2;
  tm *ptVar3;
  time_t tVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_138 [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  tm tm;
  timezone tz;
  timeval tv;
  va_list argptr;
  
  argptr[0].reg_save_area = auStack_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  argptr[0].gp_offset = 8;
  argptr[0].fp_offset = 0x30;
  argptr[0].overflow_arg_area = &stack0x00000008;
  local_130 = in_RSI;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  iVar2 = gettimeofday((timeval *)&tv,(__timezone_ptr_t)&tz);
  if (iVar2 == 0) {
    ptVar3 = localtime_r(&tv.tv_sec,(tm *)&tm);
    if (ptVar3 != (tm *)0x0) {
      fprintf(_stderr,"(%04d/%02d/%02d %02d:%02d:%02d:%06ld): ",(ulong)(tm.tm_year + 0x76c),
              (ulong)(tm.tm_mon + 1),(ulong)(uint)tm.tm_mday,(ulong)(uint)tm.tm_hour,
              (ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,tv.tv_usec);
      goto LAB_0010236e;
    }
  }
  __stream = _stderr;
  tVar4 = time((time_t *)0x0);
  fprintf(__stream,"(%jd): ",tVar4);
LAB_0010236e:
  vfprintf(_stderr,frmt,argptr);
  fputc(10,_stderr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void lrtr_dbg(const char *frmt, ...)
{
#ifndef NDEBUG
	va_list argptr;
	struct timeval tv;
	struct timezone tz;

	va_start(argptr, frmt);

	bool fail = true;

	if (gettimeofday(&tv, &tz) == 0) {
		struct tm tm;

		if (localtime_r(&tv.tv_sec, &tm)) {
			fprintf(stderr, "(%04d/%02d/%02d %02d:%02d:%02d:%06ld): ", tm.tm_year + 1900, tm.tm_mon + 1,
				tm.tm_mday, tm.tm_hour, tm.tm_min, tm.tm_sec, tv.tv_usec);
			fail = false;
		}
	}

	if (fail)
		fprintf(stderr, "(%jd): ", (intmax_t)time(0));

	vfprintf(stderr, frmt, argptr);
	fprintf(stderr, "\n");
	va_end(argptr);
#endif
}